

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lutf8lib.c
# Opt level: O1

int byteoffset(lua_State *L)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  lua_Integer def;
  long lVar4;
  long lVar5;
  size_t len;
  ulong local_30;
  
  luaL_checklstring(L,1,&local_30);
  lVar2 = luaL_checkinteger(L,2);
  def = 1;
  if (lVar2 < 0) {
    def = local_30 + 1;
  }
  lVar3 = luaL_optinteger(L,3,def);
  if (lVar3 < 0) {
    if (local_30 < (ulong)-lVar3) {
      lVar3 = 0;
    }
    else {
      lVar3 = lVar3 + local_30 + 1;
    }
  }
  if ((lVar3 < 1) || (lVar3 = lVar3 + -1, (long)local_30 < lVar3)) {
    luaL_argerror(L,3,"position out of range");
  }
  if (lVar2 == 0) {
    lVar4 = 0;
  }
  else if (lVar2 < 0) {
    lVar5 = lVar3;
    if (lVar3 < 1) {
      lVar4 = 1;
    }
    else {
      do {
        lVar3 = 1;
        if (lVar5 < 1) {
          lVar3 = lVar5;
        }
        if (1 < lVar5) {
          lVar3 = lVar5;
        }
        lVar3 = lVar3 + -1;
        lVar4 = lVar2 + 1;
      } while ((lVar2 < -1) && (bVar1 = 1 < lVar5, lVar2 = lVar4, lVar5 = lVar3, bVar1));
    }
  }
  else {
    for (; (lVar4 = lVar2 + -1, 1 < lVar2 && (lVar3 < (long)local_30)); lVar3 = lVar3 + 1) {
      lVar2 = lVar4;
    }
  }
  if (lVar4 == 0) {
    lua_pushinteger(L,lVar3 + 1);
  }
  else {
    lua_pushnil(L);
  }
  return 1;
}

Assistant:

static int byteoffset(lua_State *L) {
    size_t len;
    const char *s = luaL_checklstring(L, 1, &len);
    lua_Integer n = luaL_checkinteger(L, 2);
    lua_Integer posi = (n >= 0) ? 1 : len + 1;
    posi = u_posrelat(luaL_optinteger(L, 3, posi), len);
    luaL_argcheck(L, 1 <= posi && --posi <= (lua_Integer) len, 3,
                  "position out of range");
    if (n == 0) {
        /* find beginning of current byte sequence */
        while (posi > 0 && iscont(s + posi)) posi--;
    } else {
        if (iscont(s + posi))
            luaL_error(L, "initial position is a continuation byte");
        if (n < 0) {
            while (n < 0 && posi > 0) {  /* move back */
                do {  /* find beginning of previous character */
                    posi--;
                } while (posi > 0 && iscont(s + posi));
                n++;
            }
        } else {
            n--;  /* do not move for 1st character */
            while (n > 0 && posi < (lua_Integer) len) {
                do {  /* find beginning of next character */
                    posi++;
                } while (iscont(s + posi));  /* (cannot pass final '\0') */
                n--;
            }
        }
    }
    if (n == 0)  /* did it find given character? */
        lua_pushinteger(L, posi + 1);
    else  /* no such character */
        lua_pushnil(L);
    return 1;
}